

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

size_t textblock_calculate_lines
                 (textblock *tb,size_t **line_starts,size_t **line_lengths,size_t width)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  size_t in_R9;
  ulong start;
  long lVar5;
  size_t total_lines;
  size_t alloc_lines;
  size_t local_58;
  size_t **local_50;
  size_t **local_48;
  size_t local_40;
  ulong local_38;
  ulong uVar4;
  
  local_40 = 0;
  local_58 = 0;
  sVar3 = 0;
  if ((width != 0 && line_lengths != (size_t **)0x0) &&
      (line_starts != (size_t **)0x0 && tb != (textblock *)0x0)) {
    pwVar2 = tb->text;
    if ((pwVar2 == (wchar_t *)0x0) || (tb->strlen == 0)) {
      sVar3 = 0;
    }
    else {
      local_50 = line_lengths;
      local_48 = line_starts;
      new_line(line_starts,line_lengths,&local_40,&local_58,0,in_R9);
      if (tb->strlen != 0) {
        local_38 = 0;
        sVar3 = 0;
        lVar5 = 0;
        start = 0;
        do {
          wVar1 = pwVar2[start];
          if (wVar1 == L' ') {
            sVar3 = sVar3 + 1;
            local_38 = start;
          }
          else if (wVar1 == L'\n') {
            (*local_50)[lVar5] = sVar3;
            new_line(local_48,local_50,&local_40,&local_58,start + 1,in_R9);
            lVar5 = lVar5 + 1;
            sVar3 = 0;
          }
          else {
            sVar3 = sVar3 + 1;
          }
          if (sVar3 == width) {
            sVar3 = local_38 - (*local_48)[lVar5];
            uVar4 = local_38;
            if (local_38 < (*local_48)[lVar5] || sVar3 == 0) {
              sVar3 = width;
              uVar4 = start;
            }
            start = uVar4 + 1;
            (*local_50)[lVar5] = sVar3;
            new_line(local_48,local_50,&local_40,&local_58,start,in_R9);
            lVar5 = lVar5 + 1;
            sVar3 = 0;
          }
          else {
            (*local_50)[lVar5] = sVar3;
            start = start + 1;
          }
        } while (start < tb->strlen);
      }
      sVar3 = local_58;
      if ((*local_50)[local_58 - 1] == 0) {
        sVar3 = local_58 - 1;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t textblock_calculate_lines(textblock *tb, size_t **line_starts, size_t **line_lengths, size_t width)
{
	const wchar_t *text = NULL;
	size_t text_offset = 0;
	size_t alloc_lines = 0;
	size_t total_lines = 0;
	size_t current_line_index = 0;
	size_t current_line_length = 0;
	size_t breaking_char_offset = 0;

	if (tb == NULL || line_starts == NULL || line_lengths == NULL || width == 0)
		return 0;

	text = textblock_text(tb);

	if (text == NULL || tb->strlen == 0)
		return 0;

	/* Start a line, since we have at least one. */
	new_line(line_starts, line_lengths, &alloc_lines, &total_lines, 0, 0);

	while (text_offset < tb->strlen) {
		if (text[text_offset] == L'\n') {
			(*line_lengths)[current_line_index] = current_line_length;
			new_line(line_starts, line_lengths, &alloc_lines, &total_lines, text_offset + 1, 0);
			current_line_index++;
			current_line_length = 0;
		}
		else if (text[text_offset] == L' ') {
			breaking_char_offset = text_offset;
			current_line_length++;
		}
		else {
			current_line_length++;
		}

		if (current_line_length == width) {
			/* We're out of space on the line and need to break it. */

			size_t const current_line_start = (*line_starts)[current_line_index];
			size_t next_line_start_offset = 0;
			size_t adjusted_line_length = 0;

			if (breaking_char_offset > current_line_start) {
				/* If we found a breaking character on the current line, break
				 * there and start the next line on the next character. The loop
				 * then backtracks to add the already-processed characters to
				 * the next line. */
				adjusted_line_length = breaking_char_offset - current_line_start;
				next_line_start_offset = breaking_char_offset + 1;
				text_offset = breaking_char_offset + 1;
			}
			else {
				/* There was no breaking character on the current line, so we
				 * just break at the current character. This can happen with a 
				 * word that takes up the whole line, for example. */
				adjusted_line_length = width;
				next_line_start_offset = text_offset + 1;
				text_offset++;
			}

			(*line_lengths)[current_line_index] = adjusted_line_length;
			new_line(line_starts, line_lengths, &alloc_lines, &total_lines, next_line_start_offset, 0);
			current_line_index++;
			current_line_length = 0;
		}
		else {
			/* There is still space on the line, so just add the character. */
			(*line_lengths)[current_line_index] = current_line_length;
			text_offset++;
		}
	}

	/* Trim the last line if it doesn't contain any characters. */
	if ((*line_lengths)[total_lines - 1] == 0)
		total_lines--;

	return total_lines;
}